

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathFrustum.h
# Opt level: O1

float __thiscall Imath_3_2::Frustum<float>::normalizedZToDepthExc(Frustum<float> *this,float zval)

{
  domain_error *this_00;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  fVar1 = zval + zval + -1.0;
  fVar4 = this->_farPlane;
  if (this->_orthographic == true) {
    fVar2 = (fVar1 * (fVar4 - this->_nearPlane) + fVar4 + this->_nearPlane) * -0.5;
  }
  else {
    fVar3 = this->_nearPlane;
    fVar2 = (fVar4 + fVar4) * fVar3;
    fVar3 = (fVar1 * (fVar4 - fVar3) - fVar4) - fVar3;
    fVar4 = fVar3;
    if (fVar3 <= -fVar3) {
      fVar4 = -fVar3;
    }
    if (fVar4 < 1.0) {
      fVar1 = fVar2;
      if (fVar2 <= -fVar2) {
        fVar1 = -fVar2;
      }
      if (fVar4 * 3.4028235e+38 < fVar1) {
        this_00 = (domain_error *)__cxa_allocate_exception(0x10);
        std::domain_error::domain_error
                  (this_00,
                   "Frustum::normalizedZToDepth cannot be computed: near and far clipping planes of the viewing frustum may be too close to each other"
                  );
        __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
      }
    }
    fVar2 = fVar2 / fVar3;
  }
  return fVar2;
}

Assistant:

IMATH_CONSTEXPR14 T
Frustum<T>::normalizedZToDepthExc (T zval) const
{
    T Zp = zval * T (2) - T (1);

    if (_orthographic)
    {
        return -(Zp * (_farPlane - _nearPlane) + (_farPlane + _nearPlane)) /
               T (2);
    }
    else
    {
        T farTimesNear = 2 * _farPlane * _nearPlane;
        T farMinusNear = Zp * (_farPlane - _nearPlane) - _farPlane - _nearPlane;

        if (abs (farMinusNear) < 1 &&
            abs (farTimesNear) >
                std::numeric_limits<T>::max () * abs (farMinusNear))
        {
            throw std::domain_error (
                "Frustum::normalizedZToDepth cannot be computed: "
                "near and far clipping planes of the viewing frustum "
                "may be too close to each other");
        }

        return farTimesNear / farMinusNear;
    }
}